

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

PragmaName * pragmaLocate(char *zName)

{
  char *zRight;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = 0x39;
  iVar3 = 0;
  do {
    iVar2 = (iVar4 + iVar3) / 2;
    zRight = aPragmaName[iVar2].zName;
    if (zName == (char *)0x0) {
      iVar1 = -(uint)(zRight != (char *)0x0);
LAB_00148094:
      if (iVar1 == 0) {
        return aPragmaName + iVar2;
      }
    }
    else {
      if (zRight != (char *)0x0) {
        iVar1 = sqlite3StrICmp(zName,zRight);
        goto LAB_00148094;
      }
      iVar1 = 1;
    }
    if (iVar1 < 0) {
      iVar4 = iVar2 + -1;
    }
    else {
      iVar3 = iVar2 + 1;
    }
    if (iVar4 < iVar3) {
      return (PragmaName *)0x0;
    }
  } while( true );
}

Assistant:

static const PragmaName *pragmaLocate(const char *zName){
  int upr, lwr, mid = 0, rc;
  lwr = 0;
  upr = ArraySize(aPragmaName)-1;
  while( lwr<=upr ){
    mid = (lwr+upr)/2;
    rc = sqlite3_stricmp(zName, aPragmaName[mid].zName);
    if( rc==0 ) break;
    if( rc<0 ){
      upr = mid - 1;
    }else{
      lwr = mid + 1;
    }
  }
  return lwr>upr ? 0 : &aPragmaName[mid];
}